

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint32_t farmhash32_sa(char *s,size_t len)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  uint uVar8;
  uint32_t uVar9;
  long lVar10;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  int iVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar13 = (uint)len;
  if (0x18 < len) {
    if (len < 0x28) {
      uVar11 = *(int *)(s + (len - 4)) + uVar13;
      iVar22 = *(int *)(s + (len - 0x10)) + uVar13 + -0x4a380c7d;
      iVar23 = *(int *)(s + (len - 0x14)) + -0x4a380c7d;
      uVar14 = uVar11 >> 0x15 | uVar11 * 0x800;
      uVar8 = (iVar22 * 0x16a88000 | (uint)(iVar22 * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar11;
      uVar8 = (iVar23 * 0x16a88000 | (uint)(iVar23 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
      uVar8 = (uVar14 * 0x16a88000 | uVar14 * -0x3361d2af >> 0x11) * 0x1b873593 ^
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
      iVar22 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + *(int *)(s + (len - 0xc)) + -0x19ab949c;
      uVar11 = uVar11 + iVar22;
      uVar8 = ((iVar23 + *(int *)(s + (len - 8))) * 0x16a88000 |
              (uint)((iVar23 + *(int *)(s + (len - 8))) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar11;
      iVar23 = (uVar8 >> 0x13 | uVar8 << 0xd) * -0x765bf421;
      uVar13 = crc32(iVar22 + uVar11,iVar23 + -0x5fc6ae11 + *(int *)(s + (len - 0x10)) + uVar13);
      uVar18 = len + 1 >> 1;
      uVar19 = len + 1 >> 2;
      iVar22 = *(int *)(s + (uVar18 - 8));
      uVar11 = (*(uint *)(s + (uVar19 - 4)) >> 0xc | *(uint *)(s + (uVar19 - 4)) << 0x14) +
               *(int *)(s + (uVar18 - 4));
      uVar8 = (iVar22 * 0x16a88000 | (uint)(iVar22 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (int)uVar18 + *(int *)(s + uVar19) * -0x3361d2af + uVar13;
      iVar22 = (uVar11 >> 3 | uVar11 * 0x20000000) + iVar22;
      uVar11 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
               (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + uVar11 + 0xe6546b64;
      uVar8 = iVar22 + *(int *)(s + (uVar18 - 4));
      uVar13 = ((uVar13 ^ *(uint *)(s + 4)) * 0x16a88000 |
               (uVar13 ^ *(uint *)(s + 4)) * -0x3361d2af >> 0x11) * 0x1b873593 ^
               (uVar11 >> 0x13 | uVar11 << 0xd) * 5 + iVar22 + 0xe6546b64;
      uVar13 = (uVar8 >> 0xc | uVar8 * 0x100000) + *(int *)(s + uVar19) + -0x19ab949c +
               (uVar13 >> 0x13 | uVar13 << 0xd) * 5;
      uVar13 = (uVar13 >> 0x10 ^ uVar13) * -0x7a143595;
      uVar13 = (uVar13 >> 0xd ^ uVar13) * -0x3d4d51cb;
      uVar9 = (uVar13 >> 0x10 ^ uVar13) + 0xea715e6c + iVar23;
    }
    else {
      if (len < 0x50) {
        auVar31._8_4_ = 0xbe0c56a1;
        auVar31._0_8_ = 0xbe0c56a1be0c56a1;
        auVar31._12_4_ = 0xbe0c56a1;
        auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0xf >> 1)),auVar31);
        auVar27 = vpaddd_avx(*(undefined1 (*) [16])s,auVar25);
        auVar29 = vpshufd_avx(*(undefined1 (*) [16])(s + 0x10),0x39);
        auVar29 = vpaddd_avx(auVar29,auVar31);
        auVar35._8_4_ = 0xcc9e2d51;
        auVar35._0_8_ = 0xcc9e2d51cc9e2d51;
        auVar35._12_4_ = 0xcc9e2d51;
        auVar28 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar35);
        auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(s + 0x10));
        auVar5._8_4_ = 0x51;
        auVar5._0_8_ = 0x5100000051;
        auVar5._12_4_ = 0x51;
        auVar24 = vpaddd_avx512vl(auVar27,auVar5);
        auVar27 = vpaddd_avx(auVar24,auVar25);
        auVar25 = vpmulld_avx(*(undefined1 (*) [16])(s + (len - 0x20)),auVar35);
        auVar25 = vprold_avx512vl(auVar25,0x11);
        auVar6._8_4_ = 0x1b873593;
        auVar6._0_8_ = 0x1b8735931b873593;
        auVar6._12_4_ = 0x1b873593;
        auVar25 = vpmulld_avx512vl(auVar25,auVar6);
        auVar25 = vprold_avx512vl(auVar25 ^ auVar24,0x13);
        auVar24 = vpslld_avx(auVar25,2);
        auVar25 = vpaddd_avx(*(undefined1 (*) [16])(s + (len - 0x10)),auVar25);
        auVar25 = vpaddd_avx(auVar25,auVar24);
        auVar30._8_4_ = 0xe6546b64;
        auVar30._0_8_ = 0xe6546b64e6546b64;
        auVar30._12_4_ = 0xe6546b64;
        auVar25 = vpaddd_avx(auVar25,auVar30);
        auVar33 = vpshufb_avx(auVar29,auVar27);
        auVar24 = vpaddd_avx(auVar29 ^ *(undefined1 (*) [16])(s + (len - 0xf >> 1)),
                             *(undefined1 (*) [16])s);
        auVar29 = vpaddd_avx(auVar28 ^ auVar27,*(undefined1 (*) [16])(s + (len - 0x20)));
        auVar27 = vpaddd_avx(auVar28,auVar33 ^ auVar30);
        auVar28 = vpshufb_avx(auVar29,auVar25);
        auVar27 = vpaddd_avx(auVar27,auVar28);
        auVar29 = vpaddd_avx(auVar29,auVar24);
        auVar28 = vpaddd_avx(auVar29,auVar24);
        auVar24 = vpbroadcastd_avx512vl();
        auVar28 = vpmulld_avx(auVar28,auVar35);
        auVar28 = vpaddd_avx(auVar28,auVar24);
      }
      else {
        uVar18 = (len - 1) / 0x50;
        lVar7 = uVar18 * 0x50;
        lVar10 = len + uVar18 * -0x50;
        if (len == 0x50) {
          auVar25._8_4_ = 0x51;
          auVar25._0_8_ = 0x5100000051;
          auVar25._12_4_ = 0x51;
          auVar28._8_4_ = 0xbe0c56a1;
          auVar28._0_8_ = 0xbe0c56a1be0c56a1;
          auVar28._12_4_ = 0xbe0c56a1;
          auVar27._8_8_ = 0xe6546b64e6546b64;
          auVar27._0_8_ = 0xe6546b64e6546b64;
          auVar29 = auVar28;
        }
        else {
          auVar27._8_8_ = 0xe6546b64e6546b64;
          auVar27._0_8_ = 0xe6546b64e6546b64;
          auVar28._8_4_ = 0xbe0c56a1;
          auVar28._0_8_ = 0xbe0c56a1be0c56a1;
          auVar28._12_4_ = 0xbe0c56a1;
          auVar25._8_4_ = 0x51;
          auVar25._0_8_ = 0x5100000051;
          auVar25._12_4_ = 0x51;
          auVar24._8_4_ = 0xcc9e2d51;
          auVar24._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar24._12_4_ = 0xcc9e2d51;
          auVar33._8_4_ = 0x1b873593;
          auVar33._0_8_ = 0x1b8735931b873593;
          auVar33._12_4_ = 0x1b873593;
          pauVar20 = (undefined1 (*) [16])s;
          auVar29 = auVar28;
          do {
            auVar5 = *pauVar20;
            pauVar1 = pauVar20 + 1;
            pauVar2 = pauVar20 + 2;
            pauVar3 = pauVar20 + 3;
            pauVar4 = pauVar20 + 4;
            pauVar20 = pauVar20 + 5;
            uVar18 = uVar18 - 1;
            auVar25 = vpaddd_avx(auVar5,auVar25);
            auVar28 = vpaddd_avx(*pauVar1,auVar28);
            auVar36 = vpshufd_avx(auVar28,0x39);
            auVar29 = vpaddd_avx(*pauVar2,auVar29);
            auVar28 = vpmulld_avx(*pauVar4,auVar24);
            auVar28 = vpaddd_avx(auVar28,*pauVar1);
            auVar25 = vpaddd_avx(auVar25,auVar29);
            auVar29 = vpaddd_avx(auVar25,auVar29);
            auVar26 = vpmulld_avx(*pauVar3,auVar24);
            auVar26 = vprold_avx512vl(auVar26,0x11);
            auVar26 = vpmulld_avx(auVar26,auVar33);
            auVar25 = vprold_avx512vl(auVar26 ^ auVar25,0x13);
            auVar26 = vpslld_avx(auVar25,2);
            auVar25 = vpaddd_avx(auVar26,auVar25);
            auVar26 = vpaddd_avx(*pauVar4,auVar27);
            auVar25 = vpaddd_avx(auVar26,auVar25);
            auVar26 = vpshufb_avx(auVar36,auVar29);
            auVar5 = vpaddd_avx(*pauVar2 ^ auVar36,auVar5);
            auVar29 = vpaddd_avx(*pauVar3,auVar29 ^ auVar28);
            auVar36 = vpshufb_avx(auVar29,auVar25);
            auVar27 = vpaddd_avx(auVar28,auVar26 ^ auVar27);
            auVar27 = vpaddd_avx(auVar27,auVar36);
            auVar29 = vpaddd_avx(auVar29,auVar5);
            auVar28 = vpaddd_avx(auVar29,auVar5);
            auVar29 = vpmulld_avx(auVar29,auVar24);
          } while (uVar18 != 0);
          s = s + lVar7;
        }
        if (lVar10 != 0) {
          auVar24 = vpbroadcastd_avx512vl();
          auVar25 = vpaddd_avx(auVar25,auVar24);
          auVar25 = vpaddd_avx(auVar25,*(undefined1 (*) [16])(s + lVar10 + -0x50));
          auVar28 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar10 + -0x40),auVar28);
          auVar5 = vpshufd_avx(auVar28,0x39);
          auVar29 = vpaddd_avx(auVar29,*(undefined1 (*) [16])(s + lVar10 + -0x30));
          auVar36._8_4_ = 0xcc9e2d51;
          auVar36._0_8_ = 0xcc9e2d51cc9e2d51;
          auVar36._12_4_ = 0xcc9e2d51;
          auVar28 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar10 + -0x10),auVar36);
          auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(s + lVar10 + -0x40));
          auVar25 = vpaddd_avx(auVar25,auVar29);
          auVar29 = vpaddd_avx(auVar25,auVar29);
          auVar24 = vpmulld_avx(*(undefined1 (*) [16])(s + lVar10 + -0x20),auVar36);
          auVar24 = vprold_avx512vl(auVar24,0x11);
          auVar26._8_4_ = 0x1b873593;
          auVar26._0_8_ = 0x1b8735931b873593;
          auVar26._12_4_ = 0x1b873593;
          auVar24 = vpmulld_avx512vl(auVar24,auVar26);
          auVar25 = vprold_avx512vl(auVar24 ^ auVar25,0x13);
          auVar24 = vpslld_avx(auVar25,2);
          auVar25 = vpaddd_avx(auVar24,auVar25);
          auVar24 = vpaddd_avx(*(undefined1 (*) [16])(s + lVar10 + -0x10),auVar27);
          auVar25 = vpaddd_avx(auVar24,auVar25);
          auVar33 = vpshufb_avx(auVar5,auVar29);
          auVar24 = vpaddd_avx(auVar5 ^ *(undefined1 (*) [16])(s + lVar10 + -0x30),
                               *(undefined1 (*) [16])(s + lVar10 + -0x50));
          auVar29 = vpaddd_avx(auVar29 ^ auVar28,*(undefined1 (*) [16])(s + lVar10 + -0x20));
          auVar5 = vpshufb_avx(auVar29,auVar25);
          auVar27 = vpaddd_avx(auVar28,auVar33 ^ auVar27);
          auVar27 = vpaddd_avx(auVar27,auVar5);
          auVar29 = vpaddd_avx(auVar29,auVar24);
          auVar28 = vpaddd_avx(auVar29,auVar24);
          auVar29 = vpmulld_avx(auVar29,auVar36);
        }
      }
      auVar28 = vpshufd_avx(auVar28,0x39);
      auVar32._8_4_ = 0xcc9e2d51;
      auVar32._0_8_ = 0xcc9e2d51cc9e2d51;
      auVar32._12_4_ = 0xcc9e2d51;
      auVar29 = vpmulld_avx(auVar29,auVar32);
      auVar34._8_4_ = 0x1b873593;
      auVar34._0_8_ = 0x1b8735931b873593;
      auVar34._12_4_ = 0x1b873593;
      auVar27 = vpmulld_avx(auVar28 ^ auVar27,auVar34);
      auVar28 = vpmulld_avx(auVar28,auVar32);
      auVar24 = vpmulld_avx(auVar25,auVar34);
      auVar25 = vpshufb_avx(auVar28,auVar29);
      auVar25 = vpaddd_avx(auVar27,auVar25);
      auVar27 = vpaddd_avx(auVar24,auVar29);
      auVar29 = vpaddd_avx(auVar27,auVar29);
      auVar28 = vpaddd_avx(auVar25,auVar28);
      auVar25 = vpaddd_avx(auVar28,auVar25);
      auVar24 = vpshufb_avx(auVar29,auVar27);
      auVar25 = auVar25 ^ auVar24;
      uVar12 = crc32(auVar29._0_4_,auVar29._12_4_);
      iVar22 = crc32(auVar29._4_4_,auVar28._0_4_);
      uVar15 = crc32(auVar29._8_4_ * -0x3361d2af,auVar28._4_4_);
      iVar23 = crc32(uVar12,auVar28._8_4_);
      iVar22 = crc32(iVar22 * -0x3361d2af,auVar28._12_4_);
      iVar16 = crc32(uVar15,auVar25._0_4_);
      uVar12 = crc32(iVar23 * -0x3361d2af,auVar25._4_4_);
      iVar23 = crc32(iVar22,auVar25._8_4_);
      uVar15 = crc32(iVar16 * -0x3361d2af,auVar25._12_4_);
      uVar12 = crc32(uVar12,auVar27._0_4_);
      iVar21 = crc32(iVar23 * -0x3361d2af,auVar27._4_4_);
      iVar16 = crc32(uVar15,auVar27._8_4_);
      iVar23 = crc32(uVar12,auVar27._12_4_);
      uVar9 = ((iVar21 + iVar22) - (iVar23 + iVar16)) * -0x3361d2af;
    }
    return uVar9;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar8 = 0;
        uVar11 = 9;
      }
      else {
        uVar11 = 9;
        uVar8 = 0;
        sVar17 = 0;
        do {
          uVar8 = uVar8 * -0x3361d2af + (int)s[sVar17];
          uVar11 = uVar11 ^ uVar8;
          sVar17 = sVar17 + 1;
        } while (len != sVar17);
      }
      uVar11 = (uVar13 * 0x16a88000 | uVar13 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar11;
      uVar13 = uVar11 >> 0x13 | uVar11 << 0xd;
    }
    else {
      iVar22 = *(int *)(s + (len - 4)) + uVar13 * 5;
      uVar8 = *(int *)(s + (ulong)(uVar13 >> 3 & 1) * 4) + 9;
      uVar13 = ((*(int *)s + uVar13) * 0x16a88000 | (*(int *)s + uVar13) * -0x3361d2af >> 0x11) *
               0x1b873593 ^ uVar13 * 5;
      uVar13 = (iVar22 * 0x16a88000 | (uint)(iVar22 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
               (uVar13 >> 0x13 | uVar13 << 0xd) * 5 + 0xe6546b64;
      uVar13 = uVar13 >> 0x13 | uVar13 << 0xd;
    }
    uVar13 = (uVar8 * 0x16a88000 | uVar8 * -0x3361d2af >> 0x11) * 0x1b873593 ^
             uVar13 * 5 + 0xe6546b64;
    uVar13 = (uVar13 >> 0x13 | uVar13 << 0xd) * 5 + 0xe6546b64;
    uVar13 = uVar13 >> 0x10 ^ uVar13;
  }
  else {
    iVar22 = *(int *)(s + (len - 8));
    uVar8 = (iVar22 * 0x16a88000 | (uint)(iVar22 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar13 + *(int *)(s + (len >> 1)) * -0x3361d2af;
    uVar13 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
             *(int *)(s + (len - 4));
    iVar22 = (uVar13 >> 3 | uVar13 * 0x20000000) + iVar22;
    uVar13 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
             (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + uVar13 + 0xe6546b64;
    uVar8 = iVar22 + *(int *)(s + (len - 4));
    uVar13 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
             0x1b873593 ^ (uVar13 >> 0x13 | uVar13 << 0xd) * 5 + iVar22 + 0xe6546b64;
    uVar13 = (uVar8 >> 0xc | uVar8 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
             (uVar13 >> 0x13 | uVar13 << 0xd) * 5;
    uVar13 = uVar13 >> 0x10 ^ uVar13;
  }
  uVar13 = (uVar13 * -0x7a143595 >> 0xd ^ uVar13 * -0x7a143595) * -0x3d4d51cb;
  return uVar13 >> 0x10 ^ uVar13;
}

Assistant:

uint32_t farmhash32_sa(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhash32_mk_len_0_to_4(s, len, 0) :
         farmhash32_mk_len_5_to_12(s, len, 0)) :
        farmhash32_mk_len_13_to_24(s, len, 0);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += fetch32(s + len - 4);
    b += fetch32(s + len - 20);
    c += fetch32(s + len - 16);
    uint32_t d = a;
    a = ror32(a, 21);
    a = mur(a, mur(b, mur(c, d)));
    a += fetch32(s + len - 12);
    b += fetch32(s + len - 8);
    d += a;
    a += d;
    b = mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhash32_mk_len_13_to_24(s, (len + 1) / 2, a) + b;
  }

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  if (len < 80) {
    __m128i a = fetch128(s);
    __m128i b = fetch128(s + 16);
    __m128i c = fetch128(s + (len - 15) / 2);
    __m128i d = fetch128(s + len - 32);
    __m128i e = fetch128(s + len - 16);
    h = add32x4(h, a);
    g = add32x4(g, b);
    g = shuf32x4_0_3_2_1(g);
    f = add32x4(f, c);
    __m128i be = add32x4(b, mul32x4(e, cc1));
    h = add32x4(h, f);
    f = add32x4(f, h);
    h = add32x4(murk(d, h, cc1, cc2, k), e);
    k = xor128(k, _mm_shuffle_epi8(g, f));
    g = add32x4(xor128(c, g), a);
    f = add32x4(xor128(be, f), d);
    k = add32x4(k, be);
    k = add32x4(k, _mm_shuffle_epi8(f, h));
    f = add32x4(f, g);
    g = add32x4(g, f);
    g = add32x4(_mm_set1_epi32(len), mul32x4(g, cc1));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhash32_mk.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#define CHUNK() do {                             \
  __m128i a = fetch128(s);                       \
  __m128i b = fetch128(s + 16);                  \
  __m128i c = fetch128(s + 32);                  \
  __m128i d = fetch128(s + 48);                  \
  __m128i e = fetch128(s + 64);                  \
  h = add32x4(h, a);                             \
  g = add32x4(g, b);                             \
  g = shuf32x4_0_3_2_1(g);                       \
  f = add32x4(f, c);                             \
  __m128i be = add32x4(b, mul32x4(e, cc1));      \
  h = add32x4(h, f);                             \
  f = add32x4(f, h);                             \
  h = add32x4(murk(d, h, cc1, cc2, k), e);       \
  k = xor128(k, _mm_shuffle_epi8(g, f));         \
  g = add32x4(xor128(c, g), a);                  \
  f = add32x4(xor128(be, f), d);                 \
  k = add32x4(k, be);                            \
  k = add32x4(k, _mm_shuffle_epi8(f, h));        \
  f = add32x4(f, g);                             \
  g = add32x4(g, f);                             \
  f = mul32x4(f, cc1);                           \
} while (0)

    while (iters-- != 0) {
      CHUNK();
      s += 80;
    }

    if (len != 0) {
      h = add32x4(h, _mm_set1_epi32(len));
      s = s + len - 80;
      CHUNK();
    }
  }

  g = shuf32x4_0_3_2_1(g);
  k = xor128(k, g);
  f = mul32x4(f, cc1);
  k = mul32x4(k, cc2);
  g = mul32x4(g, cc1);
  h = mul32x4(h, cc2);
  k = add32x4(k, _mm_shuffle_epi8(g, f));
  h = add32x4(h, f);
  f = add32x4(f, h);
  g = add32x4(g, k);
  k = add32x4(k, g);
  k = xor128(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = (char*) buf;
  uint32_t x = fetch32(s);
  uint32_t y = fetch32(s+4);
  uint32_t z = fetch32(s+8);
  x = _mm_crc32_u32(x, fetch32(s+12));
  y = _mm_crc32_u32(y, fetch32(s+16));
  z = _mm_crc32_u32(z * c1, fetch32(s+20));
  x = _mm_crc32_u32(x, fetch32(s+24));
  y = _mm_crc32_u32(y * c1, fetch32(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, fetch32(s+32));
  x = _mm_crc32_u32(x * c1, fetch32(s+36));
  y = _mm_crc32_u32(y, fetch32(s+40));
  z = _mm_crc32_u32(z * c1, fetch32(s+44));
  x = _mm_crc32_u32(x, fetch32(s+48));
  y = _mm_crc32_u32(y * c1, fetch32(s+52));
  z = _mm_crc32_u32(z, fetch32(s+56));
  x = _mm_crc32_u32(x, fetch32(s+60));
  return (o - x + y - z) * c1;
}